

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>
eastl::
equal_range<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
          (pair<char,_int> *first,pair<char,_int> *last,char *value)

{
  char cVar1;
  pair<char,_int> *ppVar2;
  pair<char,_int> *ppVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> pVar8;
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> pVar9;
  pair<char,_int> *ppVar3;
  
  uVar6 = (long)last - (long)first >> 3;
  if ((long)uVar6 < 1) {
    pVar9.second = first;
    pVar9.first = first;
    return pVar9;
  }
  cVar1 = *value;
  do {
    uVar5 = uVar6 >> 1;
    ppVar4 = first + uVar5;
    if (ppVar4->first < cVar1) {
      first = ppVar4 + 1;
      uVar5 = ~uVar5 + uVar6;
      ppVar4 = last;
    }
    else if (ppVar4->first <= cVar1) {
      if (uVar6 != 1) {
        do {
          uVar6 = uVar5 >> 1;
          uVar7 = ~uVar6 + uVar5;
          uVar5 = uVar6;
          if (first[uVar6].first < cVar1) {
            first = first + uVar6 + 1;
            uVar5 = uVar7;
          }
        } while (0 < (long)uVar5);
      }
      ppVar2 = ppVar4 + 1;
      uVar6 = (long)last - (long)(ppVar4 + 1) >> 3;
      while (ppVar3 = ppVar2, 0 < (long)uVar6) {
        uVar5 = uVar6 >> 1;
        ppVar2 = ppVar3 + uVar5 + 1;
        uVar6 = ~uVar5 + uVar6;
        if (cVar1 < ppVar3[uVar5].first) {
          ppVar2 = ppVar3;
          uVar6 = uVar5;
        }
      }
LAB_00104d8d:
      pVar8.second = ppVar3;
      pVar8.first = first;
      return pVar8;
    }
    ppVar3 = first;
    last = ppVar4;
    uVar6 = uVar5;
    if ((long)uVar5 < 1) goto LAB_00104d8d;
  } while( true );
}

Assistant:

pair<ForwardIterator, ForwardIterator>
    equal_range(ForwardIterator first, ForwardIterator last, const T& value, Compare compare)
    {
        typedef pair<ForwardIterator, ForwardIterator> ResultType;
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last);

        while(d > 0)
        {
            ForwardIterator i(first);
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2);

            if(compare(*i, value))
            {
                EASTL_VALIDATE_COMPARE(!compare(value, *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else if(compare(value, *i))
            {
                EASTL_VALIDATE_COMPARE(!compare(*i, value)); // Validate that the compare function is sane.
                d    = d2;
                last = i;
            }
            else
            {
                ForwardIterator j(i);

                return ResultType(eastl::lower_bound(first, i, value, compare), 
                                  eastl::upper_bound(++j, last, value, compare));
            }
        }
        return ResultType(first, first);
    }